

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcPrePartialsStates
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1
          ,int *states2,double *matrices2,int startPattern,int endPattern)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int iVar22;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double m132;
  double m131;
  double m130;
  double m123;
  double m122;
  double m121;
  double m120;
  double m113;
  double m112;
  double m111;
  double m110;
  double m103;
  double m102;
  double m101;
  double m100;
  int w;
  int u;
  int l;
  undefined4 local_c4;
  double sum13;
  double sum12;
  double sum11;
  double sum10;
  double sum23;
  double sum22;
  double sum21;
  double sum20;
  undefined4 local_38;
  int state2;
  double p13;
  double p12;
  double p11;
  double p10;
  int k;
  double m133;
  
  for (state2 = 0; state2 < *(int *)(in_RDI + 0x34); state2 = state2 + 1) {
    local_38 = state2 * 4 * *(int *)(in_RDI + 0x18);
    if (m131._0_4_ != 0) {
      local_38 = m131._0_4_ * 4 + local_38;
    }
    iVar22 = state2 * 0x14;
    uVar1 = *(ulong *)(in_RCX + (long)iVar22 * 8);
    uVar2 = *(ulong *)(in_RCX + (long)(iVar22 + 1) * 8);
    uVar3 = *(ulong *)(in_RCX + (long)(iVar22 + 2) * 8);
    uVar4 = *(ulong *)(in_RCX + (long)(iVar22 + 3) * 8);
    dVar5 = *(double *)(in_RCX + (long)(iVar22 + 5) * 8);
    dVar6 = *(double *)(in_RCX + (long)(iVar22 + 6) * 8);
    dVar7 = *(double *)(in_RCX + (long)(iVar22 + 7) * 8);
    dVar8 = *(double *)(in_RCX + (long)(iVar22 + 8) * 8);
    uVar9 = *(ulong *)(in_RCX + (long)(iVar22 + 10) * 8);
    uVar10 = *(ulong *)(in_RCX + (long)(iVar22 + 0xb) * 8);
    uVar11 = *(ulong *)(in_RCX + (long)(iVar22 + 0xc) * 8);
    uVar12 = *(ulong *)(in_RCX + (long)(iVar22 + 0xd) * 8);
    uVar13 = *(ulong *)(in_RCX + (long)(iVar22 + 0xf) * 8);
    uVar14 = *(ulong *)(in_RCX + (long)(iVar22 + 0x10) * 8);
    uVar15 = *(ulong *)(in_RCX + (long)(iVar22 + 0x11) * 8);
    uVar16 = *(ulong *)(in_RCX + (long)(iVar22 + 0x12) * 8);
    for (local_c4 = m131._0_4_; local_c4 < m130._0_4_; local_c4 = local_c4 + 1) {
      iVar17 = *(int *)(in_R8 + (long)local_c4 * 4);
      dVar18 = *(double *)(in_RDX + (long)local_38 * 8) *
               *(double *)(in_R9 + (long)(iVar22 + iVar17) * 8);
      dVar19 = *(double *)(in_RDX + (long)(local_38 + 1) * 8) *
               *(double *)(in_R9 + (long)(iVar22 + iVar17 + 5) * 8);
      dVar20 = *(double *)(in_RDX + (long)(local_38 + 2) * 8) *
               *(double *)(in_R9 + (long)(iVar22 + iVar17 + 10) * 8);
      dVar21 = *(double *)(in_RDX + (long)(local_38 + 3) * 8) *
               *(double *)(in_R9 + (long)(iVar22 + iVar17 + 0xf) * 8);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar1;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar18;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dVar5 * dVar19;
      auVar23 = vfmadd213sd_fma(auVar35,auVar23,auVar43);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar9;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar20;
      auVar23 = vfmadd213sd_fma(auVar44,auVar24,auVar23);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar13;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar21;
      auVar23 = vfmadd213sd_fma(auVar25,auVar36,auVar23);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar2;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar18;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar6 * dVar19;
      auVar24 = vfmadd213sd_fma(auVar37,auVar26,auVar45);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar10;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar20;
      auVar24 = vfmadd213sd_fma(auVar46,auVar27,auVar24);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar14;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar21;
      auVar24 = vfmadd213sd_fma(auVar28,auVar38,auVar24);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar3;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar18;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar7 * dVar19;
      auVar25 = vfmadd213sd_fma(auVar39,auVar29,auVar47);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar11;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar20;
      auVar25 = vfmadd213sd_fma(auVar48,auVar30,auVar25);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar15;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar21;
      auVar25 = vfmadd213sd_fma(auVar31,auVar40,auVar25);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar4;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = dVar18;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = dVar8 * dVar19;
      auVar26 = vfmadd213sd_fma(auVar41,auVar32,auVar49);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar12;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar20;
      auVar26 = vfmadd213sd_fma(auVar50,auVar33,auVar26);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar16;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar21;
      auVar26 = vfmadd213sd_fma(auVar34,auVar42,auVar26);
      *(long *)(in_RSI + (long)local_38 * 8) = auVar23._0_8_;
      *(long *)(in_RSI + (long)(local_38 + 1) * 8) = auVar24._0_8_;
      *(long *)(in_RSI + (long)(local_38 + 2) * 8) = auVar25._0_8_;
      *(long *)(in_RSI + (long)(local_38 + 3) * 8) = auVar26._0_8_;
      local_38 = local_38 + 4;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsStates(REALTYPE* destP,
                                                                    const REALTYPE* partials1,
                                                                    const REALTYPE* matrices1,
                                                                    const int* states2,
                                                                    const REALTYPE* matrices2,
                                                                    int startPattern,
                                                                    int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
            u += 4*startPattern;
        }
        int w = l*4*OFFSET;


        PREFETCH_MATRIX_TRANSPOSE(1, matrices1, w); //m100, m101, ..., m133
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(1, partials1, u); // p10, p11, p12, p13

            const int state2 = states2[k];
            PREFETCH_MATRIX_COLUMN(2, matrices2, w + state2); // sum20, sum21, sum22, sum23

            DO_SCHUR_PRODUCT(1, 1, 2); // reWrites p10, p11, p12, p13

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13

            // Final results
            destP[u] = sum10;
            destP[u + 1] = sum11;
            destP[u + 2] = sum12;
            destP[u + 3] = sum13;

            u += 4;

        }
    }
}